

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_status_enum.c
# Opt level: O3

void check_errorstrings(amqp_status_enum start,amqp_status_enum end)

{
  int iVar1;
  char *pcVar2;
  
  if (end < start) {
    do {
      pcVar2 = amqp_error_string2(start);
      iVar1 = strcmp(pcVar2,"(unknown error)");
      if (iVar1 == 0) {
        pcVar2 = "";
        if (start < AMQP_STATUS_OK) {
          pcVar2 = "-";
        }
        printf("amqp_status_enum value %s%X",pcVar2,(ulong)(uint)start);
        abort();
      }
      start = start + AMQP_STATUS_NO_MEMORY;
    } while (end < start);
  }
  return;
}

Assistant:

static void check_errorstrings(amqp_status_enum start, amqp_status_enum end) {
  int i;
  for (i = start; i > end; --i) {
    const char* err = amqp_error_string2(i);
    if (0 == strcmp(err, "(unknown error)")) {
      printf("amqp_status_enum value %s%X", i < 0 ? "-" : "", (unsigned)i);
      abort();
    }
  }
}